

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O1

void __thiscall
duckdb::StreamingWindowState::AggregateState::Execute
          (AggregateState *this,ExecutionContext *context,DataChunk *input,Vector *result)

{
  DataChunk *pDVar1;
  DataChunk *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  _func_int **__n;
  Vector *pVVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  element_type *peVar8;
  iterator iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  unsigned_long uVar12;
  pointer this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var14;
  reference pvVar15;
  VectorBuffer *pVVar16;
  reference pvVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  ulong uVar19;
  long lVar20;
  SelectionVector *sel_00;
  SelectionVector sel;
  vector<unsigned_long,_true> structs;
  sel_t s;
  AggregateInputData aggr_input_data;
  _Head_base<0UL,_unsigned_long_*,_false> local_f8;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  SelectionVector local_d8;
  Vector *local_c0;
  _Head_base<0UL,_unsigned_long_*,_false> local_b8;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  iterator iStack_90;
  unsigned_long *local_88;
  DataChunk *local_78;
  undefined1 local_6c [12];
  ArenaAllocator *local_60;
  undefined1 local_58;
  Vector *local_50;
  type local_48;
  SelectionVector *local_40;
  AggregateState *local_38;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)input->count;
  local_50 = result;
  local_48 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
             ::operator*(&this->wexpr->aggregate);
  local_b8._M_head_impl = (unsigned_long *)0x0;
  sStack_b0.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sStack_b0.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
  sel_00 = &this->filter_sel;
  p_Var10 = p_Var2;
  if (((Expression *)
       (this->wexpr->filter_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) &&
     (p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ExpressionExecutor::SelectExpression(&this->filter_executor,input,sel_00),
     p_Var10 < p_Var2)) {
    local_d8.sel_vector = (sel_t *)p_Var2;
    local_a0 = p_Var2;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_f8,(unsigned_long *)&local_d8);
    _Var7._M_pi = sStack_b0.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    sStack_b0.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         sStack_f0.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    sStack_b0.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_f8;
    local_f8._M_head_impl = (unsigned_long *)0x0;
    sStack_f0.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        sStack_f0.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 sStack_f0.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(&sStack_b0)
    ;
    local_b8._M_head_impl =
         (pTVar11->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    if (local_b8._M_head_impl == (unsigned_long *)0x0) {
      local_d8.sel_vector = (sel_t *)local_a0;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_f8,(unsigned_long *)&local_d8);
      _Var7._M_pi = sStack_b0.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      sStack_b0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           sStack_f0.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      sStack_b0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_f8;
      local_f8._M_head_impl = (unsigned_long *)0x0;
      sStack_f0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          sStack_f0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   sStack_f0.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&sStack_b0);
      local_b8._M_head_impl =
           (pTVar11->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    uVar19 = (ulong)((long)&p_Var2[3]._M_weak_count + 3U) >> 6;
    if (uVar19 != 1) {
      switchD_005700f1::default(local_b8._M_head_impl,0,uVar19 * 8 - 8);
    }
    uVar12 = -1L << ((byte)p_Var2 & 0x3f);
    if (((ulong)p_Var2 & 0x3f) == 0) {
      uVar12 = 0;
    }
    local_b8._M_head_impl[uVar19 - 1] = uVar12;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      psVar3 = sel_00->sel_vector;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        p_Var18 = p_Var13;
        if (psVar3 != (sel_t *)0x0) {
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)psVar3[(long)p_Var13];
        }
        if (local_b8._M_head_impl != (unsigned_long *)0x0) {
          local_b8._M_head_impl[(ulong)p_Var18 >> 6] =
               local_b8._M_head_impl[(ulong)p_Var18 >> 6] | 1L << ((byte)p_Var18 & 0x3f);
        }
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var13->_vptr__Sp_counted_base + 1);
      } while (p_Var10 != p_Var13);
    }
  }
  if ((this->wexpr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->wexpr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pdVar4 = local_50->data;
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        if (local_b8._M_head_impl == (unsigned_long *)0x0) {
          uVar19 = 1;
        }
        else {
          uVar19 = (ulong)((local_b8._M_head_impl[(ulong)p_Var10 >> 6] >> ((ulong)p_Var10 & 0x3f) &
                           1) != 0);
        }
        lVar20 = uVar19 + this->unfiltered;
        this->unfiltered = lVar20;
        *(long *)(pdVar4 + (long)p_Var10 * 8) = lVar20;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var10->_vptr__Sp_counted_base + 1);
      } while (p_Var2 != p_Var10);
    }
  }
  else {
    pDVar1 = &this->arg_chunk;
    ExpressionExecutor::Execute(&this->executor,input,pDVar1);
    DataChunk::Flatten(pDVar1);
    local_f8._M_head_impl = (unsigned_long *)0x0;
    sStack_f0.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    sStack_f0.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
    local_78 = pDVar1;
    if ((this->distinct).
        super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl !=
        (GroupedAggregateHashTable *)0x0) {
      this_00 = &this->distinct_args;
      DataChunk::Reference(this_00,pDVar1);
      if ((Expression *)
          (this->wexpr->filter_expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) {
        DataChunk::Slice(this_00,sel_00,(idx_t)p_Var10);
      }
      local_c0 = (Vector *)&this->distinct_sel;
      if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_40 = sel_00;
        DataChunk::Hash(this_00,&this->hashes);
        this_01 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                  ::operator->(&this->distinct);
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  GroupedAggregateHashTable::FindOrCreateGroups
                            (this_01,this_00,&this->hashes,&this->addresses,
                             (SelectionVector *)local_c0);
        sel_00 = local_40;
      }
      if (p_Var13 < p_Var10) {
        local_e0 = p_Var2;
        local_98 = p_Var2;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_d8,(unsigned_long *)&local_98);
        peVar8 = local_d8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        sStack_f0.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_d8.sel_vector;
        _Var7._M_pi = sStack_f0.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_d8.sel_vector = (sel_t *)0x0;
        local_d8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        sStack_f0.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
        if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_d8.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_d8.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (&sStack_f0);
        local_f8._M_head_impl =
             (pTVar11->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        if (local_f8._M_head_impl == (unsigned_long *)0x0) {
          local_98 = local_e0;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_d8,(unsigned_long *)&local_98);
          peVar8 = local_d8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          sStack_f0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_d8.sel_vector;
          _Var7._M_pi = sStack_f0.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_d8.sel_vector = (sel_t *)0x0;
          local_d8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          sStack_f0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
          if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_d8.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_d8.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&sStack_f0);
          local_f8._M_head_impl =
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          uVar19 = (ulong)((long)&p_Var2[3]._M_weak_count + 3U) >> 6;
          if (uVar19 != 1) {
            switchD_005700f1::default(local_f8._M_head_impl,0,uVar19 * 8 - 8);
          }
          _Var14._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
          .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
               (-1L << ((byte)p_Var2 & 0x3f));
          if (((ulong)p_Var2 & 0x3f) == 0) {
            _Var14._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
          }
          ((element_type *)(local_f8._M_head_impl + (uVar19 - 1)))->owned_data =
               (unsafe_unique_array<unsigned_long>)
               _Var14._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          psVar3 = *(sel_t **)&local_c0->vector_type;
          psVar5 = sel_00->sel_vector;
          p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          do {
            p_Var18 = p_Var10;
            if (psVar3 != (sel_t *)0x0) {
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)psVar3[(long)p_Var10]
              ;
            }
            if (psVar5 != (sel_t *)0x0) {
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)psVar5[(long)p_Var18]
              ;
            }
            if ((element_type *)local_f8._M_head_impl != (element_type *)0x0) {
              ((element_type *)(local_f8._M_head_impl + ((ulong)p_Var18 >> 6)))->owned_data =
                   (unsafe_unique_array<unsigned_long>)
                   ((ulong)((element_type *)(local_f8._M_head_impl + ((ulong)p_Var18 >> 6)))->
                           owned_data | 1L << ((byte)p_Var18 & 0x3f));
            }
            p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var10->_vptr__Sp_counted_base + 1);
          } while (p_Var13 != p_Var10);
        }
      }
    }
    local_6c._0_4_ = 0;
    local_d8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.sel_vector = (sel_t *)local_6c;
    pDVar1 = &this->arg_cursor;
    DataChunk::Reset(pDVar1);
    DataChunk::Slice(pDVar1,&local_d8,1);
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iStack_90._M_current = (unsigned_long *)0x0;
    local_88 = (unsigned_long *)0x0;
    local_6c._4_8_ = 0;
    if ((this->arg_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->arg_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        pvVar15 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,local_6c._4_8_);
        DictionaryVector::VerifyDictionary(pvVar15);
        pVVar16 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar15->auxiliary);
        pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_78->data,local_6c._4_8_);
        Vector::Reference((Vector *)(pVVar16 + 1),pvVar17);
        if ((pvVar15->type).physical_type_ == STRUCT) {
          if (iStack_90._M_current == local_88) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,iStack_90,
                       (unsigned_long *)(local_6c + 4));
          }
          else {
            *iStack_90._M_current = local_6c._4_8_;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
        local_6c._4_8_ = local_6c._4_8_ + 1;
      } while ((ulong)local_6c._4_8_ <
               (ulong)(((long)(this->arg_chunk).data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->arg_chunk).data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5));
    }
    local_6c._4_8_ =
         (this->wexpr->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>;
    local_60 = &this->arena_allocator;
    local_58 = 1;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_c0 = &this->statev;
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_38 = this;
      do {
        iVar9._M_current = iStack_90._M_current;
        *(int *)(_func_int ***)local_d8.sel_vector = (int)p_Var10;
        for (p_Var13 = local_98;
            p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar9._M_current;
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var13->_M_use_count) {
          __n = p_Var13->_vptr__Sp_counted_base;
          pvVar15 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,(size_type)__n);
          pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_78->data,(size_type)__n);
          Vector::Slice(pvVar15,pvVar17,&local_d8,1);
        }
        if (((local_b8._M_head_impl == (unsigned_long *)0x0) ||
            ((local_b8._M_head_impl[(ulong)p_Var10 >> 6] >> ((ulong)p_Var10 & 0x3f) & 1) != 0)) &&
           (((element_type *)local_f8._M_head_impl == (element_type *)0x0 ||
            (((ulong)(((element_type *)(local_f8._M_head_impl + ((ulong)p_Var10 >> 6)))->owned_data)
                     .super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
              >> ((ulong)p_Var10 & 0x3f) & 1) != 0)))) {
          pVVar6 = (local_38->arg_cursor).data.
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (*local_48->update)(pVVar6,(AggregateInputData *)(local_6c + 4),
                              ((long)(local_38->arg_cursor).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 3)
                              * 0x4ec4ec4ec4ec4ec5,local_c0,1);
        }
        (*local_48->finalize)
                  (local_c0,(AggregateInputData *)(local_6c + 4),local_50,1,(idx_t)p_Var10);
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var10->_vptr__Sp_counted_base + 1);
      } while (p_Var10 != p_Var2);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(local_98);
    }
    if (local_d8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (sStack_f0.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_f0.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (sStack_b0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_b0.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void StreamingWindowState::AggregateState::Execute(ExecutionContext &context, DataChunk &input, Vector &result) {
	//	Establish the aggregation environment
	const idx_t count = input.size();
	auto &aggregate = *wexpr.aggregate;
	auto &aggr_state = *this;
	auto &statev = aggr_state.statev;

	// Compute the FILTER mask (if any)
	ValidityMask filter_mask;
	auto filtered = count;
	auto &filter_sel = aggr_state.filter_sel;
	if (wexpr.filter_expr) {
		filtered = filter_executor.SelectExpression(input, filter_sel);
		if (filtered < count) {
			filter_mask.Initialize(count);
			filter_mask.SetAllInvalid(count);
			for (idx_t f = 0; f < filtered; ++f) {
				filter_mask.SetValid(filter_sel.get_index(f));
			}
		}
	}

	// Check for COUNT(*)
	if (wexpr.children.empty()) {
		D_ASSERT(GetTypeIdSize(result.GetType().InternalType()) == sizeof(int64_t));
		auto data = FlatVector::GetData<int64_t>(result);
		auto &unfiltered = aggr_state.unfiltered;
		for (idx_t i = 0; i < count; ++i) {
			unfiltered += int64_t(filter_mask.RowIsValid(i));
			data[i] = unfiltered;
		}
		return;
	}

	// Compute the arguments
	auto &arg_chunk = aggr_state.arg_chunk;
	executor.Execute(input, arg_chunk);
	arg_chunk.Flatten();

	// Update the distinct hash table
	ValidityMask distinct_mask;
	if (aggr_state.distinct) {
		auto &distinct_args = aggr_state.distinct_args;
		distinct_args.Reference(arg_chunk);
		if (wexpr.filter_expr) {
			distinct_args.Slice(filter_sel, filtered);
		}
		idx_t distinct = 0;
		auto &distinct_sel = aggr_state.distinct_sel;
		if (filtered) {
			// FindOrCreateGroups assumes non-empty input
			auto &hashes = aggr_state.hashes;
			distinct_args.Hash(hashes);

			auto &addresses = aggr_state.addresses;
			distinct = aggr_state.distinct->FindOrCreateGroups(distinct_args, hashes, addresses, distinct_sel);
		}

		//	Translate the distinct selection from filtered row numbers
		//	back to input row numbers. We need to produce output for all input rows,
		//	so we filter out
		if (distinct < filtered) {
			distinct_mask.Initialize(count);
			distinct_mask.SetAllInvalid(count);
			for (idx_t d = 0; d < distinct; ++d) {
				const auto f = distinct_sel.get_index(d);
				distinct_mask.SetValid(filter_sel.get_index(f));
			}
		}
	}

	// Iterate through them using a single SV
	sel_t s = 0;
	SelectionVector sel(&s);
	auto &arg_cursor = aggr_state.arg_cursor;
	arg_cursor.Reset();
	arg_cursor.Slice(sel, 1);
	// This doesn't work for STRUCTs because the SV
	// is not copied to the children when you slice
	vector<column_t> structs;
	for (column_t col_idx = 0; col_idx < arg_chunk.ColumnCount(); ++col_idx) {
		auto &col_vec = arg_cursor.data[col_idx];
		DictionaryVector::Child(col_vec).Reference(arg_chunk.data[col_idx]);
		if (col_vec.GetType().InternalType() == PhysicalType::STRUCT) {
			structs.emplace_back(col_idx);
		}
	}

	// Update the state and finalize it one row at a time.
	AggregateInputData aggr_input_data(wexpr.bind_info.get(), aggr_state.arena_allocator);
	for (idx_t i = 0; i < count; ++i) {
		sel.set_index(0, i);
		for (const auto struct_idx : structs) {
			arg_cursor.data[struct_idx].Slice(arg_chunk.data[struct_idx], sel, 1);
		}
		if (filter_mask.RowIsValid(i) && distinct_mask.RowIsValid(i)) {
			aggregate.update(arg_cursor.data.data(), aggr_input_data, arg_cursor.ColumnCount(), statev, 1);
		}
		aggregate.finalize(statev, aggr_input_data, result, 1, i);
	}
}